

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O1

void Am_Gesture_Abort_Do_proc(Am_Object *inter)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object feedback;
  Am_Object local_10;
  
  local_10.data = (Am_Object_Data *)0x0;
  in_value = Am_Object::Get(inter,0xdc,0);
  Am_Object::operator=(&local_10,in_value);
  bVar1 = Am_Object::Valid(&local_10);
  if (bVar1) {
    Am_Object::Set(&local_10,0x69,false,0);
  }
  Am_Object::~Am_Object(&local_10);
  return;
}

Assistant:

static void
store_classifier_results(Am_Object inter, Am_Value value,
                         Am_Feature_Vector feat, double nap, double dist)
{
  inter.Set(Am_VALUE, value);
  inter.Set(Am_START_X, (int)feat.StartX());
  inter.Set(Am_START_Y, (int)feat.StartY());
  inter.Set(Am_INITIAL_SIN, feat.InitialSin());
  inter.Set(Am_INITIAL_COS, feat.InitialCos());
  inter.Set(Am_DX2, (int)feat.Dx2());
  inter.Set(Am_DY2, (int)feat.Dy2());
  inter.Set(Am_MAGSQ2, feat.MagSq2());
  inter.Set(Am_END_X, (int)feat.EndX());
  inter.Set(Am_END_Y, (int)feat.EndY());
  inter.Set(Am_MIN_X, (int)feat.MinX());
  inter.Set(Am_MAX_X, (int)feat.MaxX());
  inter.Set(Am_MIN_Y, (int)feat.MinY());
  inter.Set(Am_MAX_Y, (int)feat.MaxY());
  inter.Set(Am_TOTAL_LENGTH, feat.PathR());
  inter.Set(Am_TOTAL_ANGLE, feat.PathTh());
  inter.Set(Am_ABS_ANGLE, feat.AbsTh());
  inter.Set(Am_SHARPNESS, feat.Sharpness());
  inter.Set(Am_NONAMBIGUITY_PROB, nap);
  inter.Set(Am_DIST_TO_MEAN, dist);
}